

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::Promise<void>_>::setCapacity(Vector<kj::Promise<void>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::Promise<void>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::Promise<void>_> newBuilder;
  size_t newSize_local;
  Vector<kj::Promise<void>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::Promise<void>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::Promise<void>_>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::Promise<void>>
            ((ArrayBuilder<kj::Promise<void>_> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::Promise<void>>>(&this->builder);
  ArrayBuilder<kj::Promise<void>>::addAll<kj::ArrayBuilder<kj::Promise<void>>>
            ((ArrayBuilder<kj::Promise<void>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::Promise<void>>>((ArrayBuilder<kj::Promise<void>_> *)local_38);
  ArrayBuilder<kj::Promise<void>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::Promise<void>_>::~ArrayBuilder((ArrayBuilder<kj::Promise<void>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }